

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_queue_tx(udp_ep *ep,nng_sockaddr *sa,udp_sp_msg *msg,nni_msg *payload)

{
  uint16_t *puVar1;
  undefined2 uVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  udp_txdesc *puVar5;
  
  if (((ep->tx_ring).count != (ep->tx_ring).size) && (ep->started != false)) {
    puVar5 = (ep->tx_ring).descs + (ep->tx_ring).head;
    (puVar5->header).mesh.us_reserved2 = (msg->mesh).us_reserved2;
    uVar3 = *(undefined8 *)&(msg->data).us_peer_id;
    *(undefined8 *)&puVar5->header = *(undefined8 *)msg;
    *(undefined8 *)((long)&puVar5->header + 8) = uVar3;
    puVar5->payload = payload;
    memcpy(&puVar5->sa,sa,0x88);
    puVar5->submitted = true;
    puVar1 = &(ep->tx_ring).count;
    *puVar1 = *puVar1 + 1;
    uVar2 = (ep->tx_ring).head;
    uVar4 = 0;
    if ((uint16_t)(uVar2 + 1) != (ep->tx_ring).size) {
      uVar4 = uVar2 + 1;
    }
    (ep->tx_ring).head = uVar4;
    udp_start_tx(ep);
    return;
  }
  nni_stat_inc(&ep->st_snd_nobuf,1);
  if (payload != (nni_msg *)0x0) {
    nni_msg_free(payload);
    return;
  }
  return;
}

Assistant:

static void
udp_queue_tx(udp_ep *ep, nng_sockaddr *sa, udp_sp_msg *msg, nni_msg *payload)
{
	udp_txring *ring = &ep->tx_ring;
	udp_txdesc *desc = &ring->descs[ring->head];

	if (ring->count == ring->size || !ep->started) {
		// ring is full
		nni_stat_inc(&ep->st_snd_nobuf, 1);
		if (payload != NULL) {
			nni_msg_free(payload);
		}
		return;
	}
#ifdef NNG_LITTLE_ENDIAN
	// This covers modern GCC, clang, Visual Studio.
	desc->header = *msg;
#else
	// Fix the endianness, so other routines don't have to.
	// It turns out that the endianness of the fields of CREQ
	// is compatible with the fields of every other message type.
	// We only have to do this for systems that are not known
	// (at compile time) to be little endian.
	desc->header.creq.us_ver     = 0x1;
	desc->header.creq.us_op_code = msg->creq.us_op_code;
	NNI_PUT16LE(&desc->header.creq.us_type, msg->creq.us_type);
	NNI_PUT32LE(&desc->header.creq.us_sended_id, msg->creq.us_sender_id);
	NNI_PUT32LE(&desc->header.creq.us_peer_id, msg->creq.us_peer_id);
	NNI_PUT32LE(&desc->header.creq.us_sequence, msg->creq.us_sequence);
	NNI_PUT16LE(&desc->header.creq.us_recv_max, msg->creq.us_recv_max);
	desc->header.creq.us_reserved = 0;
	desc->header.creq.us_refresh  = msg->creq.us_refresh;
#endif

	desc->payload   = payload;
	desc->sa        = *sa;
	desc->submitted = true;
	ring->count++;
	ring->head++;
	if (ring->head == ring->size) {
		ring->head = 0;
	}
	udp_start_tx(ep);
}